

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_setup.cpp
# Opt level: O3

void PeleLM::rhoydotSetUp(void)

{
  BndryFunc3DDefault *this;
  int indx;
  int i;
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  allocator local_239;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  BCRec bc;
  BndryFuncFabDefault local_1d8;
  BndryFunc pelelm_bndryfunc;
  
  RhoYdot_Type = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
  pelelm_bndryfunc.m_func = (BndryFuncDefault)amrex::OutStream();
  pelelm_bndryfunc._vptr_BndryFunc._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
  this = &pelelm_bndryfunc.m_func3D;
  pelelm_bndryfunc._vptr_BndryFunc._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  *(undefined8 *)((long)&pelelm_bndryfunc.m_gfunc + *(long *)(pelelm_bndryfunc.m_func3D + -0x18)) =
       *(undefined8 *)
        (pelelm_bndryfunc.m_func + *(long *)(*(long *)pelelm_bndryfunc.m_func + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"RhoYdot_Type, nrhoydot = ",0x19);
  std::ostream::operator<<(this,RhoYdot_Type);
  name._M_dataplus._M_p._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&name,1);
  std::ostream::operator<<(this,0x15);
  name._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&name,1);
  amrex::Print::~Print((Print *)&pelelm_bndryfunc);
  amrex::DescriptorList::addDescriptor
            ((DescriptorList *)amrex::AmrLevel::desc_lst,RhoYdot_Type,(IndexType)0x0,Point,1,0x15,
             (InterpBase *)amrex::eb_mf_cell_cons_interp,false,true);
  local_1d8.super__Function_base._M_functor._8_8_ = 0;
  local_1d8.super__Function_base._M_functor._M_unused._M_object = pelelm_dummy_fill;
  local_1d8._M_invoker =
       std::
       _Function_handler<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int),_void_(*)(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
       ::_M_invoke;
  local_1d8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int),_void_(*)(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
       ::_M_manager;
  amrex::StateDescriptor::BndryFunc::BndryFunc(&pelelm_bndryfunc,&local_1d8);
  if (local_1d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1d8.super__Function_base._M_manager)
              ((_Any_data *)&local_1d8,(_Any_data *)&local_1d8,__destroy_functor);
  }
  pelelm_bndryfunc.m_run_on_gpu = true;
  bc.bc[0] = -0x29a;
  bc.bc[1] = -0x29a;
  bc.bc[2] = -0x29a;
  bc.bc[3] = -0x29a;
  bc.bc[4] = -0x29a;
  bc.bc[5] = -0x29a;
  lVar1 = 0;
  do {
    bc.bc[lVar1] = rhoydot_bc[NavierStokesBase::phys_bc.bc[lVar1]];
    bc.bc[lVar1 + 3] = rhoydot_bc[NavierStokesBase::phys_bc.bc[lVar1 + 3]];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  lVar4 = 0;
  do {
    std::operator+(&local_218,"I_R[rhoY(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((spec_names_abi_cxx11_.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1))
    ;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_218);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      name.field_2._M_allocated_capacity = *psVar3;
      name.field_2._8_8_ = plVar2[3];
      name._M_dataplus._M_p = (pointer)&name.field_2;
    }
    else {
      name.field_2._M_allocated_capacity = *psVar3;
      name._M_dataplus._M_p = (pointer)*plVar2;
    }
    name._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    indx = RhoYdot_Type;
    std::__cxx11::string::string((string *)&local_218,name._M_dataplus._M_p,&local_239);
    amrex::DescriptorList::setComponent
              ((DescriptorList *)amrex::AmrLevel::desc_lst,indx,(int)lVar4,&local_218,&bc,
               &pelelm_bndryfunc,(InterpBase *)amrex::eb_mf_cell_cons_interp,0,0x14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar4 = lVar4 + 1;
    lVar1 = lVar1 + 0x20;
  } while (lVar4 != 0x15);
  amrex::StateDescriptor::BndryFunc::~BndryFunc(&pelelm_bndryfunc);
  return;
}

Assistant:

void
PeleLM::rhoydotSetUp()
{
  RhoYdot_Type       = desc_lst.size();
  const int ngrow = 1;
  int nrhoydot = NUM_SPECIES;

  amrex::Print() << "RhoYdot_Type, nrhoydot = " << RhoYdot_Type << ' ' << nrhoydot << '\n';

  desc_lst.addDescriptor(RhoYdot_Type,IndexType::TheCellType(),
                         StateDescriptor::Point,ngrow,nrhoydot,
                         &cc_interp);


  amrex::StateDescriptor::BndryFunc pelelm_bndryfunc(pelelm_dummy_fill);
  pelelm_bndryfunc.setRunOnGPU(true);  // I promise the bc function will launch gpu kernels.

	
  //const StateDescriptor& d_cell = desc_lst[State_Type];

  BCRec bc;	
  set_rhoydot_bc(bc,phys_bc);
  for (int i = 0; i < nrhoydot; i++)
  {
    const std::string name = "I_R[rhoY("+spec_names[i]+")]";
    desc_lst.setComponent(RhoYdot_Type, i, name.c_str(), bc,
                          pelelm_bndryfunc, &cc_interp, 0, nrhoydot-1);
  }
}